

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

size_t ggml_get_max_tensor_size(ggml_context *ctx)

{
  void *pvVar1;
  ggml_object *pgVar2;
  size_t sVar3;
  size_t sVar4;
  long *plVar5;
  ggml_tensor *tensor;
  char *mem_buffer;
  
  pvVar1 = ctx->mem_buffer;
  pgVar2 = ctx->objects_begin;
  tensor = (ggml_tensor *)0x0;
  do {
    if (pgVar2 == (ggml_object *)0x0) {
LAB_00119c4b:
      sVar3 = 0;
LAB_00119c4d:
      do {
        if (tensor == (ggml_tensor *)0x0) {
          return sVar3;
        }
        sVar4 = ggml_nbytes(tensor);
        if (sVar4 < sVar3) {
          sVar4 = sVar3;
        }
        for (plVar5 = (long *)tensor[-1].extra; sVar3 = sVar4, plVar5 != (long *)0x0;
            plVar5 = (long *)plVar5[2]) {
          if ((int)plVar5[3] == 0) {
            tensor = (ggml_tensor *)(*plVar5 + (long)pvVar1);
            goto LAB_00119c4d;
          }
        }
        tensor = (ggml_tensor *)0x0;
      } while( true );
    }
    if (pgVar2->type == GGML_OBJECT_TYPE_TENSOR) {
      tensor = (ggml_tensor *)(pgVar2->offs + (long)pvVar1);
      goto LAB_00119c4b;
    }
    pgVar2 = pgVar2->next;
  } while( true );
}

Assistant:

struct ggml_tensor * ggml_get_first_tensor(const struct ggml_context * ctx) {
    struct ggml_object * obj = ctx->objects_begin;

    char * const mem_buffer = ctx->mem_buffer;

    while (obj != NULL) {
        if (obj->type == GGML_OBJECT_TYPE_TENSOR) {
            return (struct ggml_tensor *)(mem_buffer + obj->offs);
        }

        obj = obj->next;
    }

    return NULL;
}